

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

void __thiscall
QRenderRule::QRenderRule(QRenderRule *this,QList<QCss::Declaration> *declarations,QObject *object)

{
  QFont *this_00;
  QSharedDataPointer<QStyleSheetBackgroundData> *this_01;
  QSharedDataPointer<QStyleSheetBorderData> *this_02;
  QPalette *pQVar1;
  undefined8 uVar2;
  QSizeF QVar3;
  int *piVar4;
  QPalettePrivate *pQVar5;
  long lVar6;
  Origin OVar7;
  Attachment AVar8;
  Representation RVar9;
  Representation RVar10;
  Attachment AVar11;
  QVariant *pQVar12;
  qsizetype qVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  char cVar18;
  bool bVar19;
  byte bVar20;
  char cVar21;
  int i;
  int iVar22;
  QStyleSheetGeometryData *ptr;
  QStyleSheetPositionData *ptr_00;
  QStyleSheetBoxData *ptr_01;
  QStyleSheetBorderData *pQVar23;
  QStyleSheetOutlineData *ptr_02;
  QStyleSheetBackgroundData *pQVar24;
  QStyleSheetPaletteData *this_03;
  QStyleSheetImageData *pQVar25;
  char *pcVar26;
  long *plVar27;
  QSize QVar28;
  QObject *pQVar29;
  QStyleSheetBorderImageData *pQVar30;
  QStyleSheetStyle *this_04;
  QArrayData *pQVar31;
  long lVar32;
  undefined8 *puVar33;
  long lVar34;
  QSharedDataPointer<QStyleSheetBorderImageData> *pQVar35;
  QWidget *this_05;
  long lVar36;
  longlong lVar37;
  QBrush *this_06;
  QSharedDataPointer<QStyleSheetPositionData> QVar38;
  ulong uVar39;
  long in_FS_OFFSET;
  undefined1 auVar40 [16];
  QStringView QVar41;
  QLatin1String QVar42;
  QStringView QVar43;
  QLatin1String QVar44;
  QLatin1String QVar45;
  QLatin1String QVar46;
  QStringView QVar47;
  QStringView QVar48;
  QLatin1String QVar49;
  QLatin1String QVar50;
  QByteArrayView layout;
  QLatin1String QVar51;
  QLatin1String QVar52;
  QLatin1String QVar53;
  QLatin1String QVar54;
  QLatin1String QVar55;
  QStringView QVar56;
  QStringView QVar57;
  QLatin1String QVar58;
  QLatin1String QVar59;
  qreal emexSize;
  TileMode vertStretch;
  int adj;
  QSize size;
  QIcon icon;
  QSize imgSize;
  QIcon imgIcon;
  QBrush accent;
  QBrush placeHolderTextForeground;
  QBrush alternateBackground;
  QBrush selectedBackground;
  QBrush selectedForeground;
  QBrush foreground;
  Origin clip;
  Attachment attachment;
  Repeat repeat;
  QBrush brush;
  int spacing;
  PositionMode mode;
  Origin origin;
  int bottom;
  int right;
  int top;
  int left;
  int maxh;
  int maxw;
  int minh;
  int minw;
  int h;
  int w;
  TileMode horizStretch;
  int integer;
  ValueExtractor v;
  double local_290;
  undefined1 *local_288;
  undefined4 local_27c;
  QSize local_278;
  QSize local_270;
  QSize local_268;
  QIcon local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  Origin local_228;
  Attachment local_224;
  QSize local_220;
  undefined1 local_218 [16];
  long local_208;
  undefined1 *local_200;
  int local_1f4;
  Int local_1f0;
  PositionMode local_1ec;
  QFlagsStorage<Qt::AlignmentFlag> local_1e8;
  Attachment local_1e4;
  Origin local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  QSharedDataPointer<QStyleSheetPositionData> local_1b8;
  QSharedDataPointer<QStyleSheetImageData> QStack_1b0;
  QArrayDataPointer<QVariant> local_198;
  QArrayDataPointer<QCss::Declaration> local_178;
  undefined1 *puStack_160;
  undefined1 *local_158;
  undefined1 *puStack_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [12];
  undefined4 uStack_11c;
  qsizetype local_118;
  anon_union_24_3_e3d07ef4_for_data local_108;
  char *local_f0;
  anon_union_24_3_e3d07ef4_for_data local_e8;
  char *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  QSize local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  QSize local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->features = 0;
  this_06 = &this->defaultBackground;
  QBrush::QBrush(this_06);
  this_00 = &this->font;
  QFont::QFont(this_00);
  this->hasFont = false;
  (this->styleHints).d = (Data *)0x0;
  (this->pal).d.ptr = (QStyleSheetPaletteData *)0x0;
  (this->b).d.ptr = (QStyleSheetBoxData *)0x0;
  (this->bg).d.ptr = (QStyleSheetBackgroundData *)0x0;
  (this->bd).d.ptr = (QStyleSheetBorderData *)0x0;
  (this->ou).d.ptr = (QStyleSheetOutlineData *)0x0;
  (this->geo).d.ptr = (QStyleSheetGeometryData *)0x0;
  (this->p).d.ptr = (QStyleSheetPositionData *)0x0;
  (this->img).d.ptr = (QStyleSheetImageData *)0x0;
  (this->iconPtr).d.ptr = (QStyleSheetImageData *)0x0;
  this->clipset = 0;
  QPainterPath::QPainterPath(&this->clipPath);
  local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_138._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QGuiApplication::palette();
  local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_148._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_158 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
  local_178.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  puStack_160 = &DAT_aaaaaaaaaaaaaaaa;
  local_178.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_178.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
  QCss::ValueExtractor::ValueExtractor
            ((ValueExtractor *)&local_178,(QList_conflict *)declarations,(QPalette *)local_138);
  iVar22 = QCss::ValueExtractor::extractStyleFeatures();
  this->features = iVar22;
  local_1bc = -1;
  local_1c0 = -1;
  local_1c4 = -1;
  local_1c8 = -1;
  local_1cc = -1;
  local_1d0 = -1;
  cVar18 = QCss::ValueExtractor::extractGeometry
                     ((int *)&local_178,&local_1bc,&local_1c0,&local_1c4,&local_1c8,&local_1cc);
  if (cVar18 != '\0') {
    ptr = (QStyleSheetGeometryData *)operator_new(0x1c);
    (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 0;
    ptr->minWidth = local_1c4;
    ptr->minHeight = local_1c8;
    ptr->width = local_1bc;
    ptr->height = local_1c0;
    ptr->maxWidth = local_1cc;
    ptr->maxHeight = local_1d0;
    QSharedDataPointer<QStyleSheetGeometryData>::reset(&this->geo,ptr);
  }
  local_1d4 = 0;
  local_1d8 = 0;
  local_1dc = 0;
  local_1e0 = Origin_Unknown;
  local_1e4 = Attachment_Unknown;
  local_1e8.i = 0;
  local_1ec = PositionMode_Unknown;
  local_1f0 = 0;
  cVar18 = QCss::ValueExtractor::extractPosition
                     ((int *)&local_178,&local_1d4,&local_1d8,&local_1dc,&local_1e0,
                      (QFlags *)&local_1e4,&local_1e8.i,(QFlags *)&local_1ec);
  if (cVar18 != '\0') {
    ptr_00 = (QStyleSheetPositionData *)operator_new(0x24);
    (ptr_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    ptr_00->left = local_1d4;
    ptr_00->top = local_1d8;
    ptr_00->bottom = local_1e0;
    ptr_00->right = local_1dc;
    ptr_00->origin = local_1e4;
    (ptr_00->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = local_1e8.i;
    ptr_00->mode = local_1ec;
    (ptr_00->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = local_1f0;
    QSharedDataPointer<QStyleSheetPositionData>::reset(&this->p,ptr_00);
  }
  local_1f4 = -1;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  cVar18 = QCss::ValueExtractor::extractBox((int *)&local_178,(int *)&local_48,(int *)&local_58);
  if (cVar18 != '\0') {
    ptr_01 = (QStyleSheetBoxData *)operator_new(0x28);
    (ptr_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    ptr_01->spacing = local_1f4;
    *(undefined8 *)ptr_01->margins = local_48;
    *(undefined8 *)(ptr_01->margins + 2) = uStack_40;
    *(undefined8 *)ptr_01->paddings = local_58;
    *(undefined8 *)(ptr_01->paddings + 2) = uStack_50;
    QSharedDataPointer<QStyleSheetBoxData>::reset(&this->b,ptr_01);
  }
  this_01 = &this->bg;
  this_02 = &this->bd;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  lVar34 = 0;
  do {
    QBrush::QBrush((QBrush *)((long)&local_88 + lVar34));
    lVar34 = lVar34 + 8;
  } while (lVar34 != 0x20);
  local_b8.wd.m_i = -1;
  local_b8.ht.m_i = -1;
  uStack_b0 = 0xffffffff;
  uStack_ac = 0xffffffff;
  local_a8 = 0xffffffff;
  uStack_a4 = 0xffffffff;
  uStack_a0 = 0xffffffff;
  uStack_9c = 0xffffffff;
  local_68 = (undefined1  [16])0x0;
  local_98.wd.m_i = 1;
  local_98.ht.m_i = 1;
  uStack_90 = 0x100000001;
  cVar18 = QCss::ValueExtractor::extractBorder
                     ((int *)&local_178,(QBrush *)local_68,(BorderStyle *)&local_88,&local_98);
  if (cVar18 != '\0') {
    pQVar23 = (QStyleSheetBorderData *)operator_new(0x70);
    QStyleSheetBorderData::QStyleSheetBorderData
              (pQVar23,(int *)local_68,(QBrush *)&local_88,(BorderStyle *)&local_98,&local_b8);
    QSharedDataPointer<QStyleSheetBorderData>::reset(this_02,pQVar23);
  }
  local_c8 = 0;
  uStack_c0 = 0;
  local_68 = ZEXT816(0);
  local_98.wd.m_i = 1;
  local_98.ht.m_i = 1;
  uStack_90 = 0x100000001;
  cVar18 = QCss::ValueExtractor::extractOutline
                     ((int *)&local_178,(QBrush *)local_68,(BorderStyle *)&local_88,&local_98,
                      (int *)&local_b8);
  if (cVar18 != '\0') {
    ptr_02 = (QStyleSheetOutlineData *)operator_new(0x80);
    QStyleSheetBorderData::QStyleSheetBorderData
              ((QStyleSheetBorderData *)ptr_02,(int *)local_68,(QBrush *)&local_88,
               (BorderStyle *)&local_98,&local_b8);
    *(undefined8 *)ptr_02->offsets = local_c8;
    *(undefined8 *)(ptr_02->offsets + 2) = uStack_c0;
    QSharedDataPointer<QStyleSheetOutlineData>::reset(&this->ou,ptr_02);
  }
  local_200 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_200);
  local_218._0_8_ = (QArrayData *)0x0;
  local_218._8_8_ = (char16_t *)0x0;
  local_208 = 0;
  local_220.ht.m_i = Repeat_XY;
  local_220.wd.m_i = 0x21;
  local_224 = Attachment_Scroll;
  local_1e4 = Attachment_Fixed;
  local_228 = Origin_Border;
  cVar18 = QCss::ValueExtractor::extractBackground
                     ((QBrush *)&local_178,(QString *)&local_200,(Repeat *)local_218,
                      (QFlags *)&local_220.ht,(Origin *)&local_220,&local_1e4,&local_224);
  if (cVar18 != '\0') {
    local_e8._16_4_ = 0xaaaaaaaa;
    local_e8._20_4_ = 0xaaaaaaaa;
    local_e8._0_4_ = 0xaaaaaaaa;
    local_e8._4_4_ = 0xaaaaaaaa;
    local_e8._8_4_ = 0xaaaaaaaa;
    local_e8._12_4_ = 0xaaaaaaaa;
    QStyleSheetStyle::loadPixmap((QStyleSheetStyle *)local_e8.data,(QString *)local_218,object);
    if ((local_208 != 0) && (cVar18 = QPixmap::isNull(), cVar18 != '\0')) {
      QRenderRule((QRenderRule *)local_218);
    }
    pQVar24 = (QStyleSheetBackgroundData *)operator_new(0x40);
    AVar11 = local_1e4;
    RVar10.m_i = local_220.ht.m_i;
    RVar9.m_i = local_220.wd.m_i;
    AVar8 = local_224;
    OVar7 = local_228;
    (pQVar24->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    QBrush::QBrush(&pQVar24->brush,(QBrush *)&local_200);
    QPixmap::QPixmap(&pQVar24->pixmap,(QPixmap *)local_e8.data);
    pQVar24->repeat = RVar10.m_i;
    (pQVar24->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = RVar9.m_i;
    pQVar24->origin = AVar11;
    pQVar24->attachment = AVar8;
    pQVar24->clip = OVar7;
    QSharedDataPointer<QStyleSheetBackgroundData>::reset(this_01,pQVar24);
    QPixmap::~QPixmap((QPixmap *)local_e8.data);
  }
  local_230 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_230);
  local_238 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_238);
  local_240 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_240);
  local_248 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_248);
  local_250 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_250);
  local_258 = &DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&local_258);
  cVar18 = QCss::ValueExtractor::extractPalette
                     ((QBrush *)&local_178,(QBrush *)&local_230,(QBrush *)&local_238,
                      (QBrush *)&local_240,(QBrush *)&local_248,(QBrush *)&local_250);
  if (cVar18 != '\0') {
    this_03 = (QStyleSheetPaletteData *)operator_new(0x38);
    QStyleSheetPaletteData::QStyleSheetPaletteData
              (this_03,(QBrush *)&local_230,(QBrush *)&local_238,(QBrush *)&local_240,
               (QBrush *)&local_248,(QBrush *)&local_250,(QBrush *)&local_258);
    QSharedDataPointer<QStyleSheetPaletteData>::reset(&this->pal,this_03);
  }
  local_260.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&local_260);
  local_220.wd.m_i = 0x84;
  local_268.wd.m_i = -1;
  local_268.ht.m_i = -1;
  cVar18 = QCss::ValueExtractor::extractImage((QIcon *)&local_178,(QFlags *)&local_260,&local_220);
  if (cVar18 != '\0') {
    pQVar25 = (QStyleSheetImageData *)operator_new(0x20);
    RVar9.m_i = local_220.wd.m_i;
    (pQVar25->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    QIcon::QIcon(&pQVar25->icon,&local_260);
    (pQVar25->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = RVar9.m_i;
    pQVar25->size = local_268;
    QSharedDataPointer<QStyleSheetImageData>::reset(&this->img,pQVar25);
  }
  local_270 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon((QIcon *)&local_270);
  local_278.wd.m_i = -1;
  local_278.ht.m_i = -1;
  cVar18 = QCss::ValueExtractor::extractIcon((QIcon *)&local_178,&local_270);
  if (cVar18 != '\0') {
    pQVar25 = (QStyleSheetImageData *)operator_new(0x20);
    (pQVar25->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    QIcon::QIcon(&pQVar25->icon,(QIcon *)&local_270);
    (pQVar25->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = 0x84;
    pQVar25->size = local_278;
    QSharedDataPointer<QStyleSheetImageData>::reset(&this->iconPtr,pQVar25);
  }
  local_27c = 0xffffff01;
  bVar19 = (bool)QCss::ValueExtractor::extractFont((QFont *)&local_178,(int *)this_00);
  this->hasFont = bVar19;
  if (object != (QObject *)0x0) {
    (*(code *)**(undefined8 **)object)(object);
    pcVar26 = (char *)QMetaObject::className();
    iVar22 = qstrcmp(pcVar26,"QTipLabel");
    if (iVar22 == 0) {
      QToolTip::palette();
      uVar14 = local_138._8_4_;
      local_138._8_4_ = local_e8._8_4_;
      local_e8._8_4_ = uVar14;
      pQVar5 = (QPalettePrivate *)CONCAT44(local_e8._4_4_,local_e8._0_4_);
      local_e8._0_4_ = (undefined4)local_138._0_8_;
      local_e8._4_4_ = SUB84(local_138._0_8_,4);
      local_138._0_8_ = pQVar5;
      QPalette::~QPalette((QPalette *)&local_e8);
    }
  }
  if ((declarations->d).size != 0) {
    uVar39 = 0;
    do {
      pQVar1 = (QPalette *)((declarations->d).ptr + uVar39);
      iVar22 = *(int *)(pQVar1->d + 0x20);
      if (iVar22 == 0x54) {
        pQVar24 = (this_01->d).ptr;
        if ((pQVar24 != (QStyleSheetBackgroundData *)0x0) &&
           ((__int_type)
            (pQVar24->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1)) {
          QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_01);
        }
        pQVar24 = (this_01->d).ptr;
        if (pQVar24 != (QStyleSheetBackgroundData *)0x0) {
          if ((__int_type)
              (pQVar24->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
            QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper(this_01);
          }
          if (*(int *)(*(long *)&((this_01->d).ptr)->brush + 4) != 0) goto LAB_0035656a;
        }
        iVar22 = ::QVariant::toInt((bool *)(*(long *)(pQVar1->d + 0x30) + 8));
        if (iVar22 - 0x3bU < 0x16) {
          plVar27 = (long *)QPalette::brush((ColorGroup)local_138,Dark);
          QBrush::operator=(this_06,*(QColor *)(*plVar27 + 8));
        }
      }
      else if (iVar22 == 0x43) {
        local_108._0_4_ = 0;
        local_108._4_4_ = 0;
        local_108._8_4_ = 0;
        local_108._12_4_ = 0;
        local_108._16_4_ = 0;
        local_108._20_4_ = 0;
        local_1b8.d.ptr._0_4_ = 0xaaaaaaaa;
        local_288 = (undefined1 *)CONCAT44(local_288._4_4_,0xaaaaaaaa);
        local_128._0_4_ = 0xaaaaaaaa;
        local_128._4_4_ = 0xaaaaaaaa;
        local_128._8_4_ = 0xaaaaaaaa;
        uStack_11c = 0xaaaaaaaa;
        QCss::Declaration::borderImageValue
                  ((QString *)pQVar1,(int *)local_108.data,(TileMode *)local_128,
                   (TileMode *)&local_1b8);
        uVar16 = local_e8._4_4_;
        uVar14 = local_e8._0_4_;
        local_e8._0_4_ = 0x83f800;
        uVar15 = local_e8._0_4_;
        local_e8._4_4_ = 0;
        uVar17 = local_e8._4_4_;
        local_e8._0_4_ = uVar14;
        local_e8._4_4_ = uVar16;
        if ((CONCAT44(local_108._20_4_,local_108._16_4_) == 0) ||
           ((CONCAT44(local_108._20_4_,local_108._16_4_) == 4 &&
            (QVar41.m_data._4_4_ = local_108._12_4_, QVar41.m_data._0_4_ = local_108._8_4_,
            QVar41.m_size = 4, QVar51.m_data = "none", QVar51.m_size = 4,
            cVar18 = QtPrivate::equalStrings(QVar41,QVar51), cVar18 != '\0')))) {
          pQVar23 = (this_02->d).ptr;
          if ((pQVar23 != (QStyleSheetBorderData *)0x0) &&
             ((__int_type)
              (pQVar23->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1)) {
            QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_02);
          }
          pQVar23 = (this_02->d).ptr;
          if (pQVar23 != (QStyleSheetBorderData *)0x0) {
            if ((__int_type)
                (pQVar23->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1) {
              QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_02);
            }
            pQVar23 = (this_02->d).ptr;
            pQVar30 = (pQVar23->bi).d.ptr;
            pQVar35 = &pQVar23->bi;
            if ((pQVar30 != (QStyleSheetBorderImageData *)0x0) &&
               ((__atomic_base<int>)
                *(__int_type *)
                 &(pQVar30->super_QSharedData).ref.super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1)) {
              QSharedDataPointer<QStyleSheetBorderImageData>::detach_helper(pQVar35);
            }
            if ((pQVar35->d).ptr != (QStyleSheetBorderImageData *)0x0) {
              QPixmap::QPixmap((QPixmap *)&local_198);
              pQVar23 = (this_02->d).ptr;
              if ((pQVar23 != (QStyleSheetBorderData *)0x0) &&
                 ((__int_type)
                  (pQVar23->super_QSharedData).ref.super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1)) {
                QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_02);
              }
              pQVar23 = (this_02->d).ptr;
              pQVar30 = (pQVar23->bi).d.ptr;
              pQVar35 = &pQVar23->bi;
              if ((pQVar30 != (QStyleSheetBorderImageData *)0x0) &&
                 ((__atomic_base<int>)
                  *(__int_type *)
                   &(pQVar30->super_QSharedData).ref.super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1)) {
                QSharedDataPointer<QStyleSheetBorderImageData>::detach_helper(pQVar35);
              }
              pQVar30 = (pQVar35->d).ptr;
              local_e8._16_4_ = 0xaaaaaaaa;
              local_e8._20_4_ = 0xaaaaaaaa;
              local_e8._0_4_ = 0xaaaaaaaa;
              local_e8._4_4_ = 0xaaaaaaaa;
              local_e8._8_4_ = 0xaaaaaaaa;
              local_e8._12_4_ = 0xaaaaaaaa;
              QPaintDevice::QPaintDevice((QPaintDevice *)local_e8.data);
              qVar13 = local_198.size;
              local_198.size = 0;
              uVar2 = *(undefined8 *)&pQVar30->field_0x28;
              *(qsizetype *)&pQVar30->field_0x28 = qVar13;
              local_e8._16_4_ = (undefined4)uVar2;
              local_e8._20_4_ = (undefined4)((ulong)uVar2 >> 0x20);
              local_e8._0_4_ = uVar15;
              local_e8._4_4_ = uVar17;
              QPixmap::~QPixmap((QPixmap *)local_e8.data);
              QPixmap::~QPixmap((QPixmap *)&local_198);
            }
          }
        }
        else {
          if ((this_02->d).ptr == (QStyleSheetBorderData *)0x0) {
            pQVar23 = (QStyleSheetBorderData *)operator_new(0x70);
            QStyleSheetBorderData::QStyleSheetBorderData(pQVar23);
            QSharedDataPointer<QStyleSheetBorderData>::reset(this_02,pQVar23);
          }
          pQVar23 = (this_02->d).ptr;
          if ((pQVar23 != (QStyleSheetBorderData *)0x0) &&
             ((__int_type)
              (pQVar23->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1)) {
            QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_02);
          }
          if ((((this_02->d).ptr)->bi).d.ptr == (QStyleSheetBorderImageData *)0x0) {
            pQVar30 = (QStyleSheetBorderImageData *)operator_new(0x50);
            (pQVar30->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i = 0;
            QPixmap::QPixmap(&pQVar30->pixmap);
            QImage::QImage(&pQVar30->image);
            pQVar30->horizStretch = TileMode_Unknown;
            pQVar30->vertStretch = TileMode_Unknown;
            pQVar30->cuts[0] = -1;
            pQVar30->cuts[1] = -1;
            pQVar30->cuts[2] = -1;
            pQVar30->cuts[3] = -1;
            pQVar23 = (this_02->d).ptr;
            if ((pQVar23 != (QStyleSheetBorderData *)0x0) &&
               ((__int_type)
                (pQVar23->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1)) {
              QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_02);
            }
            QSharedDataPointer<QStyleSheetBorderImageData>::reset(&((this_02->d).ptr)->bi,pQVar30);
          }
          pQVar23 = (this_02->d).ptr;
          if ((pQVar23 != (QStyleSheetBorderData *)0x0) &&
             ((__int_type)
              (pQVar23->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> != 1)) {
            QSharedDataPointer<QStyleSheetBorderData>::detach_helper(this_02);
          }
          pQVar23 = (this_02->d).ptr;
          pQVar30 = (pQVar23->bi).d.ptr;
          pQVar35 = &pQVar23->bi;
          if ((pQVar30 != (QStyleSheetBorderImageData *)0x0) &&
             ((__atomic_base<int>)
              *(__int_type *)
               &(pQVar30->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1)) {
            QSharedDataPointer<QStyleSheetBorderImageData>::detach_helper(pQVar35);
          }
          pQVar30 = (pQVar35->d).ptr;
          QStyleSheetStyle::loadPixmap((QStyleSheetStyle *)&local_198,(QString *)&local_108,object);
          local_e8._16_4_ = 0xaaaaaaaa;
          local_e8._20_4_ = 0xaaaaaaaa;
          local_e8._0_4_ = 0xaaaaaaaa;
          local_e8._4_4_ = 0xaaaaaaaa;
          local_e8._8_4_ = 0xaaaaaaaa;
          local_e8._12_4_ = 0xaaaaaaaa;
          QPaintDevice::QPaintDevice((QPaintDevice *)local_e8.data);
          qVar13 = local_198.size;
          local_198.size = 0;
          uVar2 = *(undefined8 *)&pQVar30->field_0x28;
          *(qsizetype *)&pQVar30->field_0x28 = qVar13;
          local_e8._16_4_ = (undefined4)uVar2;
          local_e8._20_4_ = (undefined4)((ulong)uVar2 >> 0x20);
          local_e8._0_4_ = uVar15;
          local_e8._4_4_ = uVar17;
          QPixmap::~QPixmap((QPixmap *)local_e8.data);
          QPixmap::~QPixmap((QPixmap *)&local_198);
          lVar34 = 0;
          do {
            pQVar30->cuts[lVar34] = *(int *)(local_128 + lVar34 * 4);
            lVar34 = lVar34 + 1;
          } while (lVar34 != 4);
          pQVar30->horizStretch = (TileMode)local_1b8.d.ptr;
          pQVar30->vertStretch = (TileMode)local_288;
        }
        piVar4 = (int *)CONCAT44(local_108._4_4_,local_108._0_4_);
        local_128._0_8_ = (QArrayData *)CONCAT44(local_128._4_4_,local_128._0_4_);
        unique0x1000285a = (QArrayData *)CONCAT44(uStack_11c,local_128._8_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          local_128._0_8_ = (QArrayData *)CONCAT44(local_128._4_4_,local_128._0_4_);
          unique0x10002862 = (QArrayData *)CONCAT44(uStack_11c,local_128._8_4_);
          if (*piVar4 == 0) {
            pQVar31 = (QArrayData *)CONCAT44(local_108._4_4_,local_108._0_4_);
            lVar37 = 2;
LAB_00356545:
            QArrayData::deallocate(pQVar31,lVar37,0x10);
          }
        }
      }
      else {
        QVar42.m_size = pQVar1->d + 8;
        QVar42.m_data = &DAT_0000000a;
        cVar18 = QString::startsWith(QVar42,0x680168);
        if ((cVar18 == '\0') && (*(int *)(pQVar1->d + 0x20) == 0)) {
          bVar19 = false;
          lVar34 = 0;
          do {
            pcVar26 = *(char **)((long)knownStyleHints._M_elems + lVar34);
            if (pcVar26 == (char *)0x0) {
              lVar36 = 0;
            }
            else {
              lVar32 = -1;
              do {
                lVar36 = lVar32 + 1;
                lVar6 = lVar32 + 1;
                lVar32 = lVar36;
              } while (pcVar26[lVar6] != '\0');
            }
            lVar32 = *(long *)(pQVar1->d + 0x18);
            if (lVar32 == lVar36) {
              QVar43.m_data = *(storage_type_conflict **)(pQVar1->d + 0x10);
              QVar43.m_size = lVar32;
              QVar52.m_data = pcVar26;
              QVar52.m_size = lVar36;
              bVar20 = QtPrivate::equalStrings(QVar43,QVar52);
            }
            else {
              bVar20 = 0;
            }
            if (bVar20 != 0) {
              local_e8._0_4_ = 0;
              local_e8._4_4_ = 0;
              local_e8._8_4_ = Active;
              local_e8._12_4_ = 0;
              local_e8._16_4_ = 0;
              local_e8._20_4_ = 0;
              local_d0 = (char *)0x2;
              QVar44.m_data = pcVar26;
              QVar44.m_size = lVar36;
              QVar53.m_data = "alignment";
              QVar53.m_size = 9;
              cVar18 = QtPrivate::endsWith(QVar44,QVar53,CaseSensitive);
              if (cVar18 != '\0') {
                iVar22 = QCss::Declaration::alignmentValue();
LAB_00355ce9:
                ::QVariant::QVariant((QVariant *)&local_108,iVar22);
                ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                ::QVariant::~QVariant((QVariant *)&local_108);
                goto LAB_00355dab;
              }
              QVar45.m_data = pcVar26;
              QVar45.m_size = lVar36;
              QVar54.m_data = "color";
              QVar54.m_size = 5;
              cVar18 = QtPrivate::endsWith(QVar45,QVar54,CaseSensitive);
              if (cVar18 != '\0') {
                QPalette::QPalette((QPalette *)local_128);
                auVar40 = QCss::Declaration::colorValue(pQVar1);
                local_198.d = auVar40._0_8_;
                local_198.ptr._0_6_ = auVar40._8_6_;
                iVar22 = QColor::rgba();
                ::QVariant::QVariant((QVariant *)&local_108,iVar22);
                ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                ::QVariant::~QVariant((QVariant *)&local_108);
                QPalette::~QPalette((QPalette *)local_128);
                goto LAB_00355dab;
              }
              QVar46.m_data = pcVar26;
              QVar46.m_size = lVar36;
              QVar55.m_data = "size";
              QVar55.m_size = 4;
              cVar18 = QtPrivate::endsWith(QVar46,QVar55,CaseSensitive);
              if (cVar18 == '\0') {
                QVar49.m_data = pcVar26;
                QVar49.m_size = lVar36;
                QVar58.m_data = "icon";
                QVar58.m_size = 4;
                cVar18 = QtPrivate::endsWith(QVar49,QVar58,CaseSensitive);
                if (cVar18 != '\0') {
                  QCss::Declaration::iconValue();
                  QIcon::operator_cast_to_QVariant((QVariant *)&local_108,(QIcon *)&local_198);
                  ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                  ::QVariant::~QVariant((QVariant *)&local_108);
                  QIcon::~QIcon((QIcon *)&local_198);
                  goto LAB_00355dab;
                }
                if (lVar36 != 0xd) {
LAB_003560ca:
                  local_198.d = (Data *)CONCAT44(local_198.d._4_4_,0xaaaaaaaa);
                  QCss::Declaration::intValue((int *)pQVar1,(char *)&local_198);
                  iVar22 = (int)local_198.d;
                  goto LAB_00355ce9;
                }
                QVar50.m_data = pcVar26;
                QVar50.m_size = 0xd;
                QVar59.m_data = "button-layout";
                QVar59.m_size = 0xd;
                cVar18 = QtPrivate::equalStrings(QVar50,QVar59);
                if (((cVar18 == '\0') || (*(long *)(pQVar1->d + 0x38) == 0)) ||
                   (**(int **)(pQVar1->d + 0x30) != 4)) goto LAB_003560ca;
                ::QVariant::toString();
                QString::toLatin1_helper_inplace((QString *)local_128);
                layout.m_data = (storage_type *)stack0xfffffffffffffee0;
                layout.m_size = local_118;
                subControlLayout((QList<QVariant> *)&local_198,layout);
                ::QVariant::QVariant((QVariant *)&local_108,(QList_conflict *)&local_198);
                ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                ::QVariant::~QVariant((QVariant *)&local_108);
                QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_198);
                if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_128._0_8_,1,0x10);
                  }
                }
                if (local_1b8.d.ptr == (QStyleSheetPositionData *)0x0) goto LAB_00355dab;
                LOCK();
                *(int *)local_1b8.d.ptr = *(int *)local_1b8.d.ptr + -1;
                UNLOCK();
                QVar38.d.ptr = local_1b8.d.ptr;
                if (*(int *)local_1b8.d.ptr != 0) goto LAB_00355dab;
LAB_00356299:
                QArrayData::deallocate((QArrayData *)QVar38.d.ptr,2,0x10);
              }
              else {
                local_198.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_198.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_198.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
                ::QVariant::toString();
                qVar13 = local_198.size;
                pQVar12 = local_198.ptr;
                QVar47.m_data = (storage_type_conflict *)local_198.ptr;
                QVar47.m_size = local_198.size;
                QVar56.m_data = L"em";
                QVar56.m_size = 2;
                cVar18 = QtPrivate::endsWith(QVar47,QVar56,CaseInsensitive);
                if (cVar18 == '\0') {
                  QVar48.m_data = (storage_type_conflict *)pQVar12;
                  QVar48.m_size = qVar13;
                  QVar57.m_data = L"ex";
                  QVar57.m_size = 2;
                  cVar21 = QtPrivate::endsWith(QVar48,QVar57,CaseInsensitive);
                  if (cVar21 != '\0') goto LAB_00355ee5;
                  QVar28 = (QSize)QCss::Declaration::sizeValue();
                  ::QVariant::QVariant((QVariant *)&local_108,QVar28);
                  ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                  ::QVariant::~QVariant((QVariant *)&local_108);
                }
                else {
LAB_00355ee5:
                  local_1b8.d.ptr =
                       (totally_ordered_wrapper<QStyleSheetPositionData_*>)&DAT_aaaaaaaaaaaaaaaa;
                  QStack_1b0.d.ptr =
                       (totally_ordered_wrapper<QStyleSheetImageData_*>)&DAT_aaaaaaaaaaaaaaaa;
                  QFont::QFont((QFont *)&local_1b8,this_00);
                  if (this->hasFont == false) {
                    if (object == (QObject *)0x0) {
                      pQVar29 = (QObject *)0x0;
                    }
                    else {
                      pQVar29 = (QObject *)0x0;
                      if ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0) {
                        pQVar29 = object;
                      }
                    }
                    if (pQVar29 != (QObject *)0x0) {
                      QFont::operator=((QFont *)&local_1b8,
                                       (QFont *)(*(long *)(pQVar29 + 0x20) + 0x38));
                    }
                  }
                  local_288 = &DAT_aaaaaaaaaaaaaaaa;
                  QFontMetrics::QFontMetrics((QFontMetrics *)&local_288,(QFont *)&local_1b8);
                  if (cVar18 == '\0') {
                    iVar22 = QFontMetrics::xHeight();
                    pcVar26 = "ex";
                  }
                  else {
                    iVar22 = QFontMetrics::height();
                    pcVar26 = "em";
                  }
                  local_290 = 0.0;
                  cVar18 = QCss::Declaration::realValue((double *)pQVar1,(char *)&local_290);
                  if ((cVar18 == '\0') || (local_290 <= 0.0)) {
                    local_108._0_4_ = 2;
                    local_108._4_4_ = 0;
                    local_108._8_4_ = 0;
                    local_108._12_4_ = 0;
                    local_108._16_4_ = 0;
                    local_108._20_4_ = 0;
                    local_f0 = "default";
                    QString::toLocal8Bit_helper((QChar *)local_128,(longlong)local_198.ptr);
                    pQVar31 = stack0xfffffffffffffee0;
                    if (stack0xfffffffffffffee0 == (QArrayData *)0x0) {
                      pQVar31 = (QArrayData *)&QByteArray::_empty;
                    }
                    QMessageLogger::warning
                              ((char *)local_108.data,"Invalid \'%s\' size for %s. Skipping.",
                               pcVar26,pQVar31);
                    if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_128._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_128._0_8_,1,0x10);
                      }
                    }
                  }
                  else {
                    local_128._0_8_ = local_290 * (double)iVar22;
                    unique0x10002842 = (QArrayData *)local_128._0_8_;
                    ::QVariant::QVariant
                              ((QVariant *)&local_108,
                               (QMetaTypeInterface *)
                               &QtPrivate::QMetaTypeInterfaceWrapper<QSizeF>::metaType,local_128);
                    ::QVariant::operator=((QVariant *)(pQVar1->d + 0x40),(QVariant *)&local_108);
                    ::QVariant::~QVariant((QVariant *)&local_108);
                    QVar3.ht._0_4_ = local_128._8_4_;
                    QVar3.wd = (qreal)local_128._0_8_;
                    QVar3.ht._4_4_ = uStack_11c;
                    ::QVariant::QVariant((QVariant *)&local_108,QVar3);
                    ::QVariant::operator=((QVariant *)&local_e8,(QVariant *)&local_108);
                    ::QVariant::~QVariant((QVariant *)&local_108);
                  }
                  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_288);
                  QFont::~QFont((QFont *)&local_1b8);
                }
                if ((QStyleSheetPositionData *)local_198.d != (QStyleSheetPositionData *)0x0) {
                  LOCK();
                  ((local_198.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_198.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  QVar38.d.ptr = (totally_ordered_wrapper<QStyleSheetPositionData_*>)
                                 (totally_ordered_wrapper<QStyleSheetPositionData_*>)local_198.d;
                  if (((local_198.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) goto LAB_00356299;
                }
              }
LAB_00355dab:
              QHash<QString,QVariant>::tryEmplace_impl<QString_const&>
                        ((TryEmplaceResult *)&local_108,&this->styleHints,(QString *)(pQVar1->d + 8)
                        );
              lVar36 = *(long *)(CONCAT44(local_108._4_4_,local_108._0_4_) + 0x20);
              lVar32 = (CONCAT44(local_108._12_4_,local_108._8_4_) >> 7) * 0x90;
              ::QVariant::operator=
                        ((QVariant *)
                         (*(long *)(lVar36 + 0x80 + lVar32) +
                          (ulong)*(byte *)((ulong)(local_108._8_4_ & 0x7f) + lVar36 + lVar32) * 0x38
                         + 0x18),(QVariant *)&local_e8);
              ::QVariant::~QVariant((QVariant *)&local_e8);
              bVar19 = true;
            }
            lVar34 = lVar34 + 8;
          } while ((bVar20 | lVar34 == 0x2d0) != 1);
          if (!bVar19) {
            local_e8._0_4_ = 2;
            local_e8._4_4_ = 0;
            local_e8._8_4_ = Active;
            local_e8._12_4_ = 0;
            local_e8._16_4_ = 0;
            local_e8._20_4_ = 0;
            local_d0 = "default";
            QString::toLocal8Bit_helper((QChar *)&local_108,*(longlong *)(pQVar1->d + 0x10));
            puVar33 = (undefined8 *)CONCAT44(local_108._12_4_,local_108._8_4_);
            if (puVar33 == (undefined8 *)0x0) {
              puVar33 = &QByteArray::_empty;
            }
            QMessageLogger::warning((char *)local_e8.data,"Unknown property %s",puVar33);
            piVar4 = (int *)CONCAT44(local_108._4_4_,local_108._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                pQVar31 = (QArrayData *)CONCAT44(local_108._4_4_,local_108._0_4_);
                lVar37 = 1;
                goto LAB_00356545;
              }
            }
          }
        }
      }
LAB_0035656a:
      uVar39 = uVar39 + 1;
    } while (uVar39 < (ulong)(declarations->d).size);
  }
  if ((this_02->d).ptr != (QStyleSheetBorderData *)0x0) {
    if (object == (QObject *)0x0) {
      this_05 = (QWidget *)0x0;
    }
    else {
      this_05 = (QWidget *)0x0;
      if ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0) {
        this_05 = (QWidget *)object;
      }
    }
    if (this_05 != (QWidget *)0x0) {
      this_04 = globalStyleSheetStyle;
      if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
        QWidget::style(this_05);
        this_04 = (QStyleSheetStyle *)
                  QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
      }
      if (this_04 != (QStyleSheetStyle *)0x0) {
        iVar22 = QStyleSheetStyle::nativeFrameWidth((QStyleSheetStyle *)this_04,this_05);
        fixupBorder(this,iVar22);
      }
    }
    if ((((this_02->d).ptr)->bi).d.ptr != (QStyleSheetBorderImageData *)0x0) {
      QBrush::QBrush((QBrush *)local_e8.data);
      uVar2 = *(undefined8 *)this_06;
      *(ulong *)this_06 = CONCAT44(local_e8._4_4_,local_e8._0_4_);
      local_e8._0_4_ = (undefined4)uVar2;
      local_e8._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
      QBrush::~QBrush((QBrush *)local_e8.data);
    }
  }
  QIcon::~QIcon((QIcon *)&local_270);
  QIcon::~QIcon(&local_260);
  QBrush::~QBrush((QBrush *)&local_258);
  QBrush::~QBrush((QBrush *)&local_250);
  QBrush::~QBrush((QBrush *)&local_248);
  QBrush::~QBrush((QBrush *)&local_240);
  QBrush::~QBrush((QBrush *)&local_238);
  QBrush::~QBrush((QBrush *)&local_230);
  if ((QArrayData *)local_218._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_218._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
    }
  }
  QBrush::~QBrush((QBrush *)&local_200);
  lVar34 = 0x18;
  do {
    QBrush::~QBrush((QBrush *)((long)&local_88 + lVar34));
    lVar34 = lVar34 + -8;
  } while (lVar34 != -8);
  QPalette::~QPalette((QPalette *)local_148);
  QFont::~QFont((QFont *)&puStack_160);
  QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_178);
  QPalette::~QPalette((QPalette *)local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QRenderRule::QRenderRule(const QList<Declaration> &declarations, const QObject *object)
    : features(0),
      hasFont(false),
      pal(nullptr),
      b(nullptr),
      bg(nullptr),
      bd(nullptr),
      ou(nullptr),
      geo(nullptr),
      p(nullptr),
      img(nullptr),
      clipset(0)
{
    QPalette palette = QGuiApplication::palette(); // ###: ideally widget's palette
    ValueExtractor v(declarations, palette);
    features = v.extractStyleFeatures();

    int w = -1, h = -1, minw = -1, minh = -1, maxw = -1, maxh = -1;
    if (v.extractGeometry(&w, &h, &minw, &minh, &maxw, &maxh))
        geo = new QStyleSheetGeometryData(w, h, minw, minh, maxw, maxh);

    int left = 0, top = 0, right = 0, bottom = 0;
    Origin origin = Origin_Unknown;
    Qt::Alignment position;
    QCss::PositionMode mode = PositionMode_Unknown;
    Qt::Alignment textAlignment;
    if (v.extractPosition(&left, &top, &right, &bottom, &origin, &position, &mode, &textAlignment))
        p = new QStyleSheetPositionData(left, top, right, bottom, origin, position, mode, textAlignment);

    int margins[4], paddings[4], spacing = -1;
    for (int i = 0; i < 4; i++)
        margins[i] = paddings[i] = 0;
    if (v.extractBox(margins, paddings, &spacing))
        b = new QStyleSheetBoxData(margins, paddings, spacing);

    int borders[4];
    QBrush colors[4];
    QCss::BorderStyle styles[4];
    QSize radii[4];
    for (int i = 0; i < 4; i++) {
        borders[i] = 0;
        styles[i] = BorderStyle_None;
    }
    if (v.extractBorder(borders, colors, styles, radii))
        bd = new QStyleSheetBorderData(borders, colors, styles, radii);

    int offsets[4];
    for (int i = 0; i < 4; i++) {
        borders[i] = offsets[i] = 0;
        styles[i] = BorderStyle_None;
    }
    if (v.extractOutline(borders, colors, styles, radii, offsets))
        ou = new QStyleSheetOutlineData(borders, colors, styles, radii, offsets);

    QBrush brush;
    QString uri;
    Repeat repeat = Repeat_XY;
    Qt::Alignment alignment = Qt::AlignTop | Qt::AlignLeft;
    Attachment attachment = Attachment_Scroll;
    origin = Origin_Padding;
    Origin clip = Origin_Border;
    if (v.extractBackground(&brush, &uri, &repeat, &alignment, &origin, &attachment, &clip)) {
        QPixmap pixmap = QStyleSheetStyle::loadPixmap(uri, object);
        if (!uri.isEmpty() && pixmap.isNull())
            qWarning("Could not create pixmap from %s", qPrintable(QDir::toNativeSeparators(uri)));
        bg = new QStyleSheetBackgroundData(brush, pixmap, repeat, alignment, origin, attachment, clip);
    }

    QBrush foreground;
    QBrush selectedForeground;
    QBrush selectedBackground;
    QBrush alternateBackground;
    QBrush placeHolderTextForeground;
    QBrush accent;
    if (v.extractPalette(&foreground, &selectedForeground, &selectedBackground,
                         &alternateBackground, &placeHolderTextForeground, &accent)) {
        pal = new QStyleSheetPaletteData(foreground, selectedForeground, selectedBackground,
                                         alternateBackground, placeHolderTextForeground, accent);
    }

    QIcon imgIcon;
    alignment = Qt::AlignCenter;
    QSize imgSize;
    if (v.extractImage(&imgIcon, &alignment, &imgSize))
        img = new QStyleSheetImageData(imgIcon, alignment, imgSize);

    QIcon icon;
    QSize size;
    if (v.extractIcon(&icon, &size))
        iconPtr = new QStyleSheetImageData(icon, Qt::AlignCenter, size);

    int adj = -255;
    hasFont = v.extractFont(&font, &adj);

#if QT_CONFIG(tooltip)
    if (object && qstrcmp(object->metaObject()->className(), "QTipLabel") == 0)
        palette = QToolTip::palette();
#endif

    for (int i = 0; i < declarations.size(); i++) {
        const Declaration& decl = declarations.at(i);
        if (decl.d->propertyId == BorderImage) {
            QString uri;
            QCss::TileMode horizStretch, vertStretch;
            int cuts[4];

            decl.borderImageValue(&uri, cuts, &horizStretch, &vertStretch);
            if (uri.isEmpty() || uri == "none"_L1) {
                if (bd && bd->bi)
                    bd->bi->pixmap = QPixmap();
            } else {
                if (!bd)
                    bd = new QStyleSheetBorderData;
                if (!bd->bi)
                    bd->bi = new QStyleSheetBorderImageData;

                QStyleSheetBorderImageData *bi = bd->bi;
                bi->pixmap = QStyleSheetStyle::loadPixmap(uri, object);
                for (int i = 0; i < 4; i++)
                    bi->cuts[i] = cuts[i];
                bi->horizStretch = horizStretch;
                bi->vertStretch = vertStretch;
            }
        } else if (decl.d->propertyId == QtBackgroundRole) {
            if (bg && bg->brush.style() != Qt::NoBrush)
                continue;
            int role = decl.d->values.at(0).variant.toInt();
            if (role >= Value_FirstColorRole && role <= Value_LastColorRole)
                defaultBackground = palette.color((QPalette::ColorRole)(role-Value_FirstColorRole));
        } else if (decl.d->property.startsWith("qproperty-"_L1, Qt::CaseInsensitive)) {
            // intentionally left blank...
        } else if (decl.d->propertyId == UnknownProperty) {
            bool knownStyleHint = false;
            for (const auto sh : knownStyleHints) {
                QLatin1StringView styleHint(sh);
                if (decl.d->property == styleHint) {
                    QVariant hintValue;
                    if (styleHint.endsWith("alignment"_L1)) {
                        hintValue = (int) decl.alignmentValue();
                    } else if (styleHint.endsWith("color"_L1)) {
                        hintValue = (int) decl.colorValue().rgba();
                    } else if (styleHint.endsWith("size"_L1)) {
                        // Check only for the 'em' case
                        const QString valueString = decl.d->values.at(0).variant.toString();
                        const bool isEmSize = valueString.endsWith(u"em", Qt::CaseInsensitive);
                        if (isEmSize || valueString.endsWith(u"ex", Qt::CaseInsensitive)) {
                            // 1em == size of font; 1ex == xHeight of font
                            // See lengthValueFromData helper in qcssparser.cpp
                            QFont fontForSize(font);
                            // if no font is specified, then use the widget font if possible
                            if (const QWidget *widget; !hasFont && (widget = qobject_cast<const QWidget*>(object)))
                                fontForSize = widget->font();

                            const QFontMetrics fontMetrics(fontForSize);
                            qreal pixelSize = isEmSize ? fontMetrics.height() : fontMetrics.xHeight();

                            // Transform size according to the 'em'/'ex' value
                            qreal emexSize = {};
                            if (decl.realValue(&emexSize, isEmSize ? "em" : "ex") && emexSize > 0) {
                                pixelSize *= emexSize;
                                const QSizeF newSize(pixelSize, pixelSize);
                                decl.d->parsed = QVariant::fromValue<QSizeF>(newSize);
                                hintValue = newSize;
                            } else {
                                qWarning("Invalid '%s' size for %s. Skipping.",
                                         isEmSize ? "em" : "ex", qPrintable(valueString));
                            }
                        } else {
                            // Normal case where we receive a 'px' or 'pt' unit
                            hintValue = decl.sizeValue();
                        }
                    } else if (styleHint.endsWith("icon"_L1)) {
                        hintValue = decl.iconValue();
                    } else if (styleHint == "button-layout"_L1 && decl.d->values.size() != 0
                               && decl.d->values.at(0).type == QCss::Value::String) {
                        hintValue = subControlLayout(decl.d->values.at(0).variant.toString().toLatin1());
                    } else {
                        int integer;
                        decl.intValue(&integer);
                        hintValue = integer;
                    }
                    styleHints[decl.d->property] = hintValue;
                    knownStyleHint = true;
                    break;
                }
            }
            if (!knownStyleHint)
                qWarning("Unknown property %s", qPrintable(decl.d->property));
        }
    }

    if (hasBorder()) {
        if (const QWidget *widget = qobject_cast<const QWidget *>(object)) {
            QStyleSheetStyle *style = const_cast<QStyleSheetStyle *>(globalStyleSheetStyle);
            if (!style)
                style = qt_styleSheet(widget->style());
            if (style)
                fixupBorder(style->nativeFrameWidth(widget));
        }
        if (border()->hasBorderImage())
            defaultBackground = QBrush();
    }
}